

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResultTable.cpp
# Opt level: O0

void __thiscall celero::ResultTable::add(ResultTable *this,shared_ptr<celero::ExperimentResult> *x)

{
  byte bVar1;
  bool bVar2;
  Impl *pIVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *this_00;
  ostream *poVar6;
  Experiment *pEVar7;
  int64_t iVar8;
  uint64_t uVar9;
  Statistics<long> *pSVar10;
  long lVar11;
  reference ppVar12;
  double dVar13;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *entry_1;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *__range2;
  shared_ptr<celero::UserDefinedMeasurementCollector> udmCollector;
  shared_ptr<celero::Benchmark> local_a0;
  string local_90;
  reference local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *entry;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_48;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *local_30;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *__range3;
  shared_ptr<celero::UserDefinedMeasurementCollector> udmCollector_1;
  shared_ptr<celero::ExperimentResult> *x_local;
  ResultTable *this_local;
  
  udmCollector_1.
  super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)x;
  Pimpl<celero::ResultTable::Impl>::operator->(&this->pimpl);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 1) {
    pIVar3 = Pimpl<celero::ResultTable::Impl>::operator->(&this->pimpl);
    if ((pIVar3->hasWrittenHeader & 1U) == 0) {
      pIVar3 = Pimpl<celero::ResultTable::Impl>::operator->(&this->pimpl);
      std::operator<<((ostream *)pIVar3,"Group,Experiment,Problem Space,Samples,Iterations,Failure,"
                     );
      pIVar3 = Pimpl<celero::ResultTable::Impl>::operator->(&this->pimpl);
      std::operator<<((ostream *)pIVar3,"Baseline,us/Iteration,Iterations/sec,");
      pIVar3 = Pimpl<celero::ResultTable::Impl>::operator->(&this->pimpl);
      std::operator<<((ostream *)pIVar3,
                      "T Min (us),T Mean (us),T Max (us),T Variance,T Standard Deviation,T Skewness,T Kurtosis,T Z Score,"
                     );
      pIVar3 = Pimpl<celero::ResultTable::Impl>::operator->(&this->pimpl);
      std::operator<<((ostream *)pIVar3,
                      "R Min (us),R Mean (us),R Max (us),R Variance,R Standard Deviation,R Skewness,R Kurtosis,R Z Score,"
                     );
      std::__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)x);
      ExperimentResult::getUserDefinedMeasurements((ExperimentResult *)&__range3);
      peVar4 = std::
               __shared_ptr_access<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&__range3);
      UserDefinedMeasurementCollector::getAggregateValues_abi_cxx11_(&local_48,peVar4);
      local_30 = &local_48;
      __end3 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::begin(local_30);
      entry = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
               *)std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::end(local_30);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
                                    *)&entry);
        if (!bVar2) break;
        local_70 = __gnu_cxx::
                   __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
                   ::operator*(&__end3);
        pIVar3 = Pimpl<celero::ResultTable::Impl>::operator->(&this->pimpl);
        poVar6 = std::operator<<((ostream *)pIVar3,(string *)local_70);
        std::operator<<(poVar6,",");
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
        ::operator++(&__end3);
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
      ::~vector(&local_48);
      pIVar3 = Pimpl<celero::ResultTable::Impl>::operator->(&this->pimpl);
      std::ostream::operator<<(pIVar3,std::endl<char,std::char_traits<char>>);
      pIVar3 = Pimpl<celero::ResultTable::Impl>::operator->(&this->pimpl);
      pIVar3->hasWrittenHeader = true;
      std::shared_ptr<celero::UserDefinedMeasurementCollector>::~shared_ptr
                ((shared_ptr<celero::UserDefinedMeasurementCollector> *)&__range3);
    }
    pIVar3 = Pimpl<celero::ResultTable::Impl>::operator->(&this->pimpl);
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    ExperimentResult::getExperiment(peVar5);
    Experiment::getBenchmark((Experiment *)&local_a0);
    this_00 = std::__shared_ptr_access<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_a0);
    Benchmark::getName_abi_cxx11_(&local_90,this_00);
    poVar6 = std::operator<<((ostream *)pIVar3,(string *)&local_90);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    pEVar7 = ExperimentResult::getExperiment(peVar5);
    Experiment::getName_abi_cxx11_
              ((string *)
               &udmCollector.
                super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,pEVar7);
    poVar6 = std::operator<<(poVar6,(string *)
                                    &udmCollector.
                                     super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    iVar8 = ExperimentResult::getProblemSpaceValue(peVar5);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar8);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    pEVar7 = ExperimentResult::getExperiment(peVar5);
    uVar9 = Experiment::getSamples(pEVar7);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar9);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    uVar9 = ExperimentResult::getProblemSpaceIterations(peVar5);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar9);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    bVar2 = ExperimentResult::getFailure(peVar5);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,bVar2);
    std::operator<<(poVar6,",");
    std::__cxx11::string::~string
              ((string *)
               &udmCollector.
                super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)&local_90);
    std::shared_ptr<celero::Benchmark>::~shared_ptr(&local_a0);
    pIVar3 = Pimpl<celero::ResultTable::Impl>::operator->(&this->pimpl);
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    dVar13 = ExperimentResult::getBaselineMeasurement(peVar5);
    poVar6 = (ostream *)std::ostream::operator<<(pIVar3,dVar13);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    dVar13 = ExperimentResult::getUsPerCall(peVar5);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar13);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    dVar13 = ExperimentResult::getCallsPerSecond(peVar5);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar13);
    std::operator<<(poVar6,",");
    pIVar3 = Pimpl<celero::ResultTable::Impl>::operator->(&this->pimpl);
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    pSVar10 = ExperimentResult::getTimeStatistics(peVar5);
    lVar11 = Statistics<long>::getMin(pSVar10);
    poVar6 = (ostream *)std::ostream::operator<<(pIVar3,lVar11);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    pSVar10 = ExperimentResult::getTimeStatistics(peVar5);
    dVar13 = Statistics<long>::getMean(pSVar10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar13);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    pSVar10 = ExperimentResult::getTimeStatistics(peVar5);
    lVar11 = Statistics<long>::getMax(pSVar10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,lVar11);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    pSVar10 = ExperimentResult::getTimeStatistics(peVar5);
    dVar13 = Statistics<long>::getVariance(pSVar10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar13);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    pSVar10 = ExperimentResult::getTimeStatistics(peVar5);
    dVar13 = Statistics<long>::getStandardDeviation(pSVar10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar13);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    pSVar10 = ExperimentResult::getTimeStatistics(peVar5);
    dVar13 = Statistics<long>::getSkewness(pSVar10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar13);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    pSVar10 = ExperimentResult::getTimeStatistics(peVar5);
    dVar13 = Statistics<long>::getKurtosis(pSVar10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar13);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    pSVar10 = ExperimentResult::getTimeStatistics(peVar5);
    dVar13 = Statistics<long>::getZScore(pSVar10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar13);
    std::operator<<(poVar6,",");
    pIVar3 = Pimpl<celero::ResultTable::Impl>::operator->(&this->pimpl);
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    pSVar10 = ExperimentResult::getRAMStatistics(peVar5);
    lVar11 = Statistics<long>::getMin(pSVar10);
    poVar6 = (ostream *)std::ostream::operator<<(pIVar3,lVar11);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    pSVar10 = ExperimentResult::getRAMStatistics(peVar5);
    dVar13 = Statistics<long>::getMean(pSVar10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar13);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    pSVar10 = ExperimentResult::getRAMStatistics(peVar5);
    lVar11 = Statistics<long>::getMax(pSVar10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,lVar11);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    pSVar10 = ExperimentResult::getRAMStatistics(peVar5);
    dVar13 = Statistics<long>::getVariance(pSVar10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar13);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    pSVar10 = ExperimentResult::getRAMStatistics(peVar5);
    dVar13 = Statistics<long>::getStandardDeviation(pSVar10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar13);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    pSVar10 = ExperimentResult::getRAMStatistics(peVar5);
    dVar13 = Statistics<long>::getSkewness(pSVar10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar13);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    pSVar10 = ExperimentResult::getRAMStatistics(peVar5);
    dVar13 = Statistics<long>::getKurtosis(pSVar10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar13);
    poVar6 = std::operator<<(poVar6,",");
    peVar5 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    pSVar10 = ExperimentResult::getRAMStatistics(peVar5);
    dVar13 = Statistics<long>::getZScore(pSVar10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar13);
    std::operator<<(poVar6,",");
    std::__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)x);
    ExperimentResult::getUserDefinedMeasurements((ExperimentResult *)&__range2);
    peVar4 = std::
             __shared_ptr_access<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&__range2);
    UserDefinedMeasurementCollector::getAggregateValues_abi_cxx11_
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)&__begin2,peVar4);
    __end2 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                      *)&__begin2);
    entry_1 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
               *)std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                        *)&__begin2);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
                                  *)&entry_1);
      if (!bVar2) break;
      ppVar12 = __gnu_cxx::
                __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
                ::operator*(&__end2);
      pIVar3 = Pimpl<celero::ResultTable::Impl>::operator->(&this->pimpl);
      poVar6 = (ostream *)std::ostream::operator<<(pIVar3,ppVar12->second);
      std::operator<<(poVar6,",");
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               *)&__begin2);
    pIVar3 = Pimpl<celero::ResultTable::Impl>::operator->(&this->pimpl);
    std::ostream::operator<<(pIVar3,std::endl<char,std::char_traits<char>>);
    std::shared_ptr<celero::UserDefinedMeasurementCollector>::~shared_ptr
              ((shared_ptr<celero::UserDefinedMeasurementCollector> *)&__range2);
  }
  return;
}

Assistant:

void ResultTable::add(std::shared_ptr<celero::ExperimentResult> x)
{
	if(this->pimpl->ofs.is_open() == true)
	{
		if(this->pimpl->hasWrittenHeader == false)
		{
			// Print the header for the table.
			this->pimpl->ofs << "Group,Experiment,Problem Space,Samples,Iterations,Failure,";

			this->pimpl->ofs << "Baseline,us/Iteration,Iterations/sec,";

			this->pimpl->ofs << "T Min (us),T Mean (us),T Max (us),T Variance,T Standard Deviation,T Skewness,T Kurtosis,T Z Score,";
			this->pimpl->ofs << "R Min (us),R Mean (us),R Max (us),R Variance,R Standard Deviation,R Skewness,R Kurtosis,R Z Score,";

			// User Defined Metrics
			const auto udmCollector = x->getUserDefinedMeasurements();
			for(const auto& entry : udmCollector->getAggregateValues())
			{
				this->pimpl->ofs << entry.first << ",";
			}

			// Purposefully flushing the buffer here.
			this->pimpl->ofs << std::endl;

			this->pimpl->hasWrittenHeader = true;
		}

		// Description
		this->pimpl->ofs << x->getExperiment()->getBenchmark()->getName() << "," << x->getExperiment()->getName() << "," << x->getProblemSpaceValue()
						 << "," << x->getExperiment()->getSamples() << "," << x->getProblemSpaceIterations() << "," << x->getFailure() << ",";

		// Measurements
		this->pimpl->ofs << x->getBaselineMeasurement() << "," << x->getUsPerCall() << "," << x->getCallsPerSecond() << ",";

		// Statistics
		this->pimpl->ofs << x->getTimeStatistics().getMin() << "," << x->getTimeStatistics().getMean() << "," << x->getTimeStatistics().getMax()
						 << "," << x->getTimeStatistics().getVariance() << "," << x->getTimeStatistics().getStandardDeviation() << ","
						 << x->getTimeStatistics().getSkewness() << "," << x->getTimeStatistics().getKurtosis() << ","
						 << x->getTimeStatistics().getZScore() << ",";

		// Statistics
		this->pimpl->ofs << x->getRAMStatistics().getMin() << "," << x->getRAMStatistics().getMean() << "," << x->getRAMStatistics().getMax() << ","
						 << x->getRAMStatistics().getVariance() << "," << x->getRAMStatistics().getStandardDeviation() << ","
						 << x->getRAMStatistics().getSkewness() << "," << x->getRAMStatistics().getKurtosis() << ","
						 << x->getRAMStatistics().getZScore() << ",";

		// User Defined Metrics
		const auto udmCollector = x->getUserDefinedMeasurements();
		for(const auto& entry : udmCollector->getAggregateValues())
		{
			this->pimpl->ofs << entry.second << ",";
		}

		// Purposefully flushing the buffer here.
		this->pimpl->ofs << std::endl;
	}
}